

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalAllocateReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pnToken,int *pnOr,int *pRc)

{
  uint uVar1;
  int nTerm;
  int isPrefix;
  Fts3Phrase *pFVar2;
  char *zTerm;
  Fts3Table *p;
  int iVar3;
  ulong uVar4;
  Fts3MultiSegReader *pCsr_00;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  while( true ) {
    if (pExpr == (Fts3Expr *)0x0) {
      return;
    }
    if (*pRc != 0) {
      return;
    }
    if (pExpr->eType == 5) break;
    *pnOr = *pnOr + (uint)(pExpr->eType == 4);
    fts3EvalAllocateReaders(pCsr,pExpr->pLeft,pnToken,pnOr,pRc);
    pExpr = pExpr->pRight;
  }
  uVar1 = pExpr->pPhrase->nToken;
  *pnToken = *pnToken + uVar1;
  uVar7 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar7;
  }
  do {
    pFVar2 = pExpr->pPhrase;
    if (uVar7 == uVar4) {
      pFVar2->iDoclistToken = -1;
      return;
    }
    zTerm = pFVar2->aToken[uVar7].z;
    nTerm = pFVar2->aToken[uVar7].n;
    isPrefix = pFVar2->aToken[uVar7].isPrefix;
    pCsr_00 = (Fts3MultiSegReader *)sqlite3_malloc(0x58);
    if (pCsr_00 == (Fts3MultiSegReader *)0x0) {
      pFVar2->aToken[uVar7].pSegcsr = (Fts3MultiSegReader *)0x0;
      iVar3 = 7;
      break;
    }
    p = (Fts3Table *)(pCsr->base).pVtab;
    if (isPrefix == 0) {
LAB_001a5af8:
      iVar3 = sqlite3Fts3SegReaderCursor(p,pCsr->iLangid,0,-2,zTerm,nTerm,isPrefix,0,pCsr_00);
      pCsr_00->bLookup = (uint)(isPrefix == 0);
    }
    else {
      bVar8 = false;
      lVar5 = 0x28;
      lVar6 = 1;
      iVar3 = 7;
      while (!bVar8) {
        if (p->nIndex <= lVar6) {
          bVar8 = false;
          goto LAB_001a5a4d;
        }
        bVar8 = *(int *)((long)&p->aIndex->nPrefix + lVar5) == nTerm;
        if (bVar8) {
          iVar3 = sqlite3Fts3SegReaderCursor(p,pCsr->iLangid,(int)lVar6,-2,zTerm,nTerm,0,0,pCsr_00);
          pCsr_00->bLookup = 1;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x28;
      }
      bVar8 = true;
LAB_001a5a4d:
      lVar5 = 0x28;
      lVar6 = 1;
      while (!bVar8) {
        if (p->nIndex <= lVar6) goto LAB_001a5af8;
        bVar8 = false;
        if (*(int *)((long)&p->aIndex->nPrefix + lVar5) == nTerm + 1) {
          iVar3 = sqlite3Fts3SegReaderCursor(p,pCsr->iLangid,(int)lVar6,-2,zTerm,nTerm,1,0,pCsr_00);
          bVar8 = true;
          if (iVar3 == 0) {
            iVar3 = fts3SegReaderCursor(p,pCsr->iLangid,0,-2,zTerm,nTerm,0,0,pCsr_00);
            bVar8 = true;
          }
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x28;
      }
    }
    pFVar2->aToken[uVar7].pSegcsr = pCsr_00;
    uVar7 = uVar7 + 1;
  } while (iVar3 == 0);
  *pRc = iVar3;
  return;
}

Assistant:

static void fts3EvalAllocateReaders(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Allocate readers for this expression */
  int *pnToken,                   /* OUT: Total number of tokens in phrase. */
  int *pnOr,                      /* OUT: Total number of OR nodes in expr. */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int i;
      int nToken = pExpr->pPhrase->nToken;
      *pnToken += nToken;
      for(i=0; i<nToken; i++){
        Fts3PhraseToken *pToken = &pExpr->pPhrase->aToken[i];
        int rc = fts3TermSegReaderCursor(pCsr, 
            pToken->z, pToken->n, pToken->isPrefix, &pToken->pSegcsr
        );
        if( rc!=SQLITE_OK ){
          *pRc = rc;
          return;
        }
      }
      assert( pExpr->pPhrase->iDoclistToken==0 );
      pExpr->pPhrase->iDoclistToken = -1;
    }else{
      *pnOr += (pExpr->eType==FTSQUERY_OR);
      fts3EvalAllocateReaders(pCsr, pExpr->pLeft, pnToken, pnOr, pRc);
      fts3EvalAllocateReaders(pCsr, pExpr->pRight, pnToken, pnOr, pRc);
    }
  }
}